

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O1

PyObject * libxml_xmlSetValidErrors(PyObject *self,PyObject *args)

{
  long *plVar1;
  int iVar2;
  undefined8 *puVar3;
  PyObject *pPVar4;
  undefined8 *puVar5;
  PyObject *pyobj_arg;
  PyObject *pyobj_ctx;
  PyObject *pyobj_warn;
  PyObject *pyobj_error;
  undefined *local_28;
  long *local_20;
  long *local_18;
  
  pPVar4 = (PyObject *)0x0;
  iVar2 = _PyArg_ParseTuple_SizeT(args,"OOO|O:xmlSetValidErrors",&local_28,&local_18,&local_20);
  if (iVar2 != 0) {
    if (local_28 == &_Py_NoneStruct) {
      puVar5 = (undefined8 *)0x0;
    }
    else {
      puVar5 = *(undefined8 **)(local_28 + 0x10);
    }
    puVar3 = (undefined8 *)(*_xmlMalloc)(0x18);
    if (puVar3 == (undefined8 *)0x0) {
      iVar2 = -1;
    }
    else {
      *puVar3 = 0;
      puVar3[1] = 0;
      puVar3[2] = 0;
      plVar1 = (long *)puVar3[1];
      if ((plVar1 != (long *)0x0) && (*plVar1 = *plVar1 + -1, *plVar1 == 0)) {
        _Py_Dealloc();
      }
      if (local_18 != (long *)0x0) {
        *local_18 = *local_18 + 1;
      }
      puVar3[1] = local_18;
      plVar1 = (long *)*puVar3;
      if ((plVar1 != (long *)0x0) && (*plVar1 = *plVar1 + -1, *plVar1 == 0)) {
        _Py_Dealloc();
      }
      if (local_20 != (long *)0x0) {
        *local_20 = *local_20 + 1;
      }
      *puVar3 = local_20;
      plVar1 = (long *)puVar3[2];
      if ((plVar1 != (long *)0x0) && (*plVar1 = *plVar1 + -1, *plVar1 == 0)) {
        _Py_Dealloc();
      }
      __Py_NoneStruct = __Py_NoneStruct + 1;
      puVar3[2] = &_Py_NoneStruct;
      puVar5[1] = libxml_xmlValidCtxtErrorFuncHandler;
      puVar5[2] = libxml_xmlValidCtxtWarningFuncHandler;
      *puVar5 = puVar3;
      iVar2 = 1;
    }
    pPVar4 = libxml_intWrap(iVar2);
  }
  return pPVar4;
}

Assistant:

static PyObject *
libxml_xmlSetValidErrors(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
    PyObject *py_retval;
    PyObject *pyobj_error;
    PyObject *pyobj_warn;
    PyObject *pyobj_ctx;
    PyObject *pyobj_arg = Py_None;
    xmlValidCtxtPtr ctxt;
    xmlValidCtxtPyCtxtPtr pyCtxt;

    if (!PyArg_ParseTuple
        (args, (char *) "OOO|O:xmlSetValidErrors", &pyobj_ctx, &pyobj_error, &pyobj_warn, &pyobj_arg))
        return (NULL);

#ifdef DEBUG_ERROR
    printf("libxml_xmlSetValidErrors(%p, %p, %p) called\n", pyobj_ctx, pyobj_error, pyobj_warn);
#endif

    ctxt = PyValidCtxt_Get(pyobj_ctx);
    pyCtxt = xmlMalloc(sizeof(xmlValidCtxtPyCtxt));
    if (pyCtxt == NULL) {
            py_retval = libxml_intWrap(-1);
            return(py_retval);
    }
    memset(pyCtxt, 0, sizeof(xmlValidCtxtPyCtxt));

    
    /* TODO: check warn and error is a function ! */
    Py_XDECREF(pyCtxt->error);
    Py_XINCREF(pyobj_error);
    pyCtxt->error = pyobj_error;
    
    Py_XDECREF(pyCtxt->warn);
    Py_XINCREF(pyobj_warn);
    pyCtxt->warn = pyobj_warn;
    
    Py_XDECREF(pyCtxt->arg);
    Py_XINCREF(pyobj_arg);
    pyCtxt->arg = pyobj_arg;

    ctxt->error = libxml_xmlValidCtxtErrorFuncHandler;
    ctxt->warning = libxml_xmlValidCtxtWarningFuncHandler;
    ctxt->userData = pyCtxt;

    py_retval = libxml_intWrap(1);
    return (py_retval);
}